

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeEdgeCotanWeights
          (EmbeddedGeometryInterface *this)

{
  pointer puVar1;
  pointer puVar2;
  Vector3 *pVVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index IVar13;
  char cVar14;
  size_t i;
  runtime_error *this_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  allocator local_1c1;
  double local_1c0;
  Edge e;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> __begin3;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  MeshData<geometrycentral::surface::Edge,_double> local_80;
  RangeSetBase<geometrycentral::surface::EdgeRangeF> local_48;
  
  DependentQuantity::ensureHave(&(this->vertexPositionsQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Edge,_double>::MeshData
            (&local_80,
             (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
             super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Edge,_double>::operator=
            (&(this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
              edgeCotanWeights,&local_80);
  MeshData<geometrycentral::surface::Edge,_double>::~MeshData(&local_80);
  local_48.mesh =
       (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
       super_BaseGeometryInterface.mesh;
  local_48.iEnd = (local_48.mesh)->nEdgesFillCount;
  local_48.iStart = 0;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin(&__begin2,&local_48);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end(&__end2,&local_48);
  do {
    if (__begin2.iCurr == __end2.iCurr) {
      return;
    }
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         __begin2.mesh;
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         __begin2.iCurr;
    Edge::adjacentInteriorHalfedges
              ((NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> *
               )&local_80,&e);
    NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>::begin
              (&__begin3,
               (NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> *
               )&local_80);
    cVar14 = (char)local_80.expandCallbackIt._M_node;
    IVar13 = local_80.data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    local_1c0 = 0.0;
    while ((__begin3.justStarted != (bool)cVar14 ||
           (__begin3.state.currE.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind != IVar13))) {
      puVar1 = ((__begin3.state.currE.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (puVar1[puVar1[puVar1[__begin3.state.currE.
                               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                               .ind]]] !=
          __begin3.state.currE.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_158,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/embedded_geometry_interface.cpp"
                   ,&local_1c1);
        ::std::operator+(&local_138,"GC_SAFETY_ASSERT FAILURE from ",&local_158);
        ::std::operator+(&local_118,&local_138,":");
        ::std::__cxx11::to_string(&local_178,0x135);
        ::std::operator+(&local_f8,&local_118,&local_178);
        ::std::operator+(&local_d8,&local_f8," - ");
        ::std::operator+(&local_b8,&local_d8,"faces must be triangular");
        ::std::runtime_error::runtime_error(this_00,(string *)&local_b8);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      puVar2 = ((__begin3.state.currE.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heVertexArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar3 = (this->vertexPositions).data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar4 = puVar2[puVar1[puVar1[__begin3.state.currE.
                                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                   .ind]]];
      uVar5 = puVar2[puVar1[__begin3.state.currE.
                            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .ind]];
      uVar6 = puVar2[__begin3.state.currE.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind];
      dVar7 = pVVar3[uVar6].y - pVVar3[uVar4].y;
      dVar8 = pVVar3[uVar5].y - pVVar3[uVar4].y;
      dVar9 = pVVar3[uVar6].x - pVVar3[uVar4].x;
      dVar10 = pVVar3[uVar6].z - pVVar3[uVar4].z;
      dVar11 = pVVar3[uVar5].x - pVVar3[uVar4].x;
      dVar12 = pVVar3[uVar5].z - pVVar3[uVar4].z;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar11;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar7 * dVar8;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar9;
      auVar16 = vfmadd231sd_fma(auVar21,auVar24,auVar18);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar12;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar8 * dVar10;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar7;
      auVar21 = vfmsub231sd_fma(auVar22,auVar25,auVar15);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar10;
      auVar15 = vfmadd231sd_fma(auVar16,auVar23,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar12 * dVar9;
      auVar16 = vfmsub231sd_fma(auVar16,auVar18,auVar23);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar7 * dVar11;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar8;
      auVar18 = vfmsub231sd_fma(auVar19,auVar24,auVar20);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar16._0_8_ * auVar16._0_8_;
      auVar16 = vfmadd231sd_fma(auVar17,auVar21,auVar21);
      auVar16 = vfmadd231sd_fma(auVar16,auVar18,auVar18);
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      local_1c0 = local_1c0 + (auVar15._0_8_ / auVar16._0_8_) * 0.5;
      NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>::
      operator++(&__begin3);
    }
    (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.edgeCotanWeights.data.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    [e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind] =
         local_1c0;
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++(&__begin2);
  } while( true );
}

Assistant:

void EmbeddedGeometryInterface::computeEdgeCotanWeights() {
  vertexPositionsQ.ensureHave();

  edgeCotanWeights = EdgeData<double>(mesh);

  for (Edge e : mesh.edges()) {
    double cotSum = 0.;

    for (Halfedge he : e.adjacentInteriorHalfedges()) {
      // WARNING: Logic duplicated between cached and immediate version
      Halfedge heFirst = he;
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pA = vertexPositions[he.vertex()];
      GC_SAFETY_ASSERT(he.next() == heFirst, "faces must be triangular");

      Vector3 vecR = pB - pA;
      Vector3 vecL = pC - pA;

      double cotValue = dot(vecR, vecL) / norm(cross(vecR, vecL));
      cotSum += cotValue / 2;
    }

    edgeCotanWeights[e] = cotSum;
  }
}